

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops-raw-skt.c
# Opt level: O2

int rops_adoption_bind_raw_skt(lws *wsi,int type,char *vh_prot_name)

{
  int iVar1;
  lws_udp *plVar2;
  lwsi_state state;
  lws_protocols *p;
  
  iVar1 = 0;
  if ((type & 0x1000003U) == 2) {
    if ((type & 0x10U) != 0) {
      plVar2 = (lws_udp *)lws_realloc((void *)0x0,0x28,"udp struct");
      wsi->udp = plVar2;
    }
    state = LRS_SSL_INIT;
    if ((type & 4U) == 0) {
      state = LRS_ESTABLISHED;
    }
    lws_role_transition(wsi,0,state,&role_ops_raw_skt);
    if (vh_prot_name == (char *)0x0) {
      p = wsi->vhost->protocols + wsi->vhost->raw_protocol_index;
    }
    else {
      p = wsi->protocol;
    }
    lws_bind_protocol(wsi,p,"rops_adoption_bind_raw_skt");
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int
rops_adoption_bind_raw_skt(struct lws *wsi, int type, const char *vh_prot_name)
{
	/* no http but socket... must be raw skt */
	if ((type & LWS_ADOPT_HTTP) || !(type & LWS_ADOPT_SOCKET) ||
	    (type & _LWS_ADOPT_FINISH))
		return 0; /* no match */

#if defined(LWS_WITH_UDP)
	if (type & LWS_ADOPT_FLAG_UDP)
		/*
		 * these can be >128 bytes, so just alloc for UDP
		 */
		wsi->udp = lws_malloc(sizeof(*wsi->udp), "udp struct");
#endif

	lws_role_transition(wsi, 0, (type & LWS_ADOPT_ALLOW_SSL) ? LRS_SSL_INIT :
				LRS_ESTABLISHED, &role_ops_raw_skt);

	if (vh_prot_name)
		lws_bind_protocol(wsi, wsi->protocol, __func__);
	else
		/* this is the only time he will transition */
		lws_bind_protocol(wsi,
			&wsi->vhost->protocols[wsi->vhost->raw_protocol_index],
			__func__);

	return 1; /* bound */
}